

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFloatExc.cpp
# Opt level: O0

void Iex_3_4::anon_unknown_8::fpeHandler(int type,char *explanation)

{
  undefined8 uVar1;
  InvalidFpOpExc *this;
  char *text;
  undefined4 in_EDI;
  char *in_stack_ffffffffffffffa8;
  MathExc *in_stack_ffffffffffffffb0;
  
  switch(in_EDI) {
  case 1:
    uVar1 = __cxa_allocate_exception(0x48);
    OverflowExc::OverflowExc((OverflowExc *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __cxa_throw(uVar1,&OverflowExc::typeinfo,OverflowExc::~OverflowExc);
  case 2:
    uVar1 = __cxa_allocate_exception(0x48);
    UnderflowExc::UnderflowExc((UnderflowExc *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __cxa_throw(uVar1,&UnderflowExc::typeinfo,UnderflowExc::~UnderflowExc);
  default:
    text = (char *)__cxa_allocate_exception(0x48);
    MathExc::MathExc(in_stack_ffffffffffffffb0,text);
    __cxa_throw(text,&MathExc::typeinfo,MathExc::~MathExc);
  case 4:
    uVar1 = __cxa_allocate_exception(0x48);
    DivzeroExc::DivzeroExc((DivzeroExc *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __cxa_throw(uVar1,&DivzeroExc::typeinfo,DivzeroExc::~DivzeroExc);
  case 8:
    uVar1 = __cxa_allocate_exception(0x48);
    InexactExc::InexactExc((InexactExc *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __cxa_throw(uVar1,&InexactExc::typeinfo,InexactExc::~InexactExc);
  case 0x10:
    this = (InvalidFpOpExc *)__cxa_allocate_exception(0x48);
    InvalidFpOpExc::InvalidFpOpExc(this,in_stack_ffffffffffffffa8);
    __cxa_throw(this,&InvalidFpOpExc::typeinfo,InvalidFpOpExc::~InvalidFpOpExc);
  }
}

Assistant:

void
fpeHandler (int type, const char explanation[])
{
    switch (type)
    {
        case IEEE_OVERFLOW: throw OverflowExc (explanation);

        case IEEE_UNDERFLOW: throw UnderflowExc (explanation);

        case IEEE_DIVZERO: throw DivzeroExc (explanation);

        case IEEE_INEXACT: throw InexactExc (explanation);

        case IEEE_INVALID: throw InvalidFpOpExc (explanation);
    }

    throw MathExc (explanation);
}